

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::Tree::_lookup_path_or_create(Tree *this,csubstr path,size_t start)

{
  size_t sVar1;
  csubstr cVar2;
  lookup_result r;
  lookup_result local_48;
  
  if (start == 0xffffffffffffffff) {
    start = root_id(this);
  }
  local_48.target = 0xffffffffffffffff;
  local_48.path_pos = 0;
  local_48.closest = start;
  local_48.path.str = path.str;
  local_48.path.len = path.len;
  _lookup_path(this,&local_48);
  sVar1 = local_48.target;
  if (local_48.target == 0xffffffffffffffff) {
    _lookup_path_modify(this,&local_48);
    sVar1 = local_48.target;
  }
  else {
    cVar2 = lookup_result::unresolved(&local_48);
    if (cVar2.str != (char *)0x0 && cVar2.len != 0) {
      _lookup_path_or_create();
    }
  }
  return sVar1;
}

Assistant:

size_t Tree::_lookup_path_or_create(csubstr path, size_t start)
{
    if(start == NONE)
        start = root_id();
    lookup_result r(path, start);
    _lookup_path(&r);
    if(r.target != NONE)
    {
        C4_ASSERT(r.unresolved().empty());
        return r.target;
    }
    _lookup_path_modify(&r);
    return r.target;
}